

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenOperator(Lexer *this)

{
  TokenType type;
  undefined8 *puVar1;
  bool bVar2;
  size_t __s2;
  size_t __n;
  int iVar3;
  Token *this_00;
  Lexer *in_RSI;
  undefined8 *puVar4;
  string op;
  Position local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  type = TOK_ERR;
  do {
    local_70.line = (size_t)&local_70.endIndex;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_50,local_50 + local_48);
    std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_70.startIndex,0,'\x01');
    __n = local_70.startIndex;
    __s2 = local_70.line;
    if (local_70.startIndex - 4 < 0xfffffffffffffffd) {
      bVar2 = false;
    }
    else {
      puVar1 = *(undefined8 **)(KEYWORDS_abi_cxx11_ + local_70.startIndex * 0x18 + 0xa0);
      for (puVar4 = *(undefined8 **)(KEYWORDS_abi_cxx11_ + local_70.startIndex * 0x18 + 0x98);
          puVar4 != puVar1; puVar4 = puVar4 + 5) {
        if ((puVar4[1] == __n) && (iVar3 = bcmp((void *)*puVar4,(void *)__s2,__n), iVar3 == 0)) {
          type = *(TokenType *)(puVar4 + 4);
          bVar2 = true;
          goto LAB_00107a89;
        }
      }
      bVar2 = false;
    }
LAB_00107a89:
    if ((size_t *)__s2 != &local_70.endIndex) {
      operator_delete((void *)__s2,local_70.endIndex + 1);
    }
    if (!bVar2) break;
    std::__cxx11::string::push_back((char)&local_50);
    nextChar(in_RSI);
  } while( true );
  if (local_48 == 0) {
    this->_vptr_Lexer = (_func_int **)0x0;
    goto LAB_00107b4e;
  }
  if (type == TOK_OP_DIV) {
    if (in_RSI->currentChar == 0x2f) {
      nextLineComment(this);
      goto LAB_00107b4e;
    }
    if (in_RSI->currentChar == 0x2a) {
      nextRegionComment(this);
      goto LAB_00107b4e;
    }
  }
  getCurrentCursor(&local_70,in_RSI);
  this_00 = (Token *)operator_new(0x30);
  Token::Token(this_00,in_RSI->currentToken,type,&local_70);
  this->_vptr_Lexer = (_func_int **)this_00;
LAB_00107b4e:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenOperator() noexcept {
  std::string op;
  TokenType operatorType = TokenType::TOK_ERR;
  while (_hasOperatorStr(op + (char) currentChar, operatorType)) {
    op += (char) currentChar;
    nextChar();
  }
  // no match
  if (op.empty())
    return nullptr;

  // if match check if comment (starting with '/')
  if (operatorType == TokenType::TOK_OP_DIV) {
    if (currentChar == '*') // region comment
      return nextRegionComment();
    else if (currentChar == '/') // one line comment
      return nextLineComment();
  }

  return std::make_unique<Token>(currentToken, operatorType, getCurrentCursor());
}